

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O1

QFixed __thiscall QFontEngine::lineThickness(QFontEngine *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (int)(((double)((uint)((ulong)*(undefined8 *)&(this->fontDef).field_0x60 >> 0x28) & 0x3ff)
                * (this->fontDef).pixelSize) / 10.0);
  iVar2 = iVar3 >> 0x1f;
  iVar1 = iVar3 / 700 + iVar2;
  iVar4 = 0x80;
  if (0x15d < iVar3 - 0x41aU) {
    iVar4 = ((iVar1 - iVar2) + (uint)(iVar1 == iVar2)) * 0x40;
  }
  return (QFixed)iVar4;
}

Assistant:

QFixed QFontEngine::lineThickness() const
{
    // ad hoc algorithm
    int score = fontDef.weight * fontDef.pixelSize / 10;
    int lw = score / 700;

    // looks better with thicker line for small pointsizes
    if (lw < 2 && score >= 1050) lw = 2;
    if (lw == 0) lw = 1;

    return lw;
}